

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  Token t;
  bool bVar1;
  Token *__src;
  Token local_50;
  WastParser *local_10;
  WastParser *this_local;
  
  local_10 = this;
  bVar1 = TokenQueue::empty(&this->tokens_);
  if (bVar1) {
    WastLexer::GetToken(&local_50,this->lexer_);
    t.loc.filename._M_str = local_50.loc.filename._M_str;
    t.loc.filename._M_len = local_50.loc.filename._M_len;
    t.loc.field_1.field_1.offset = local_50.loc.field_1.field_1.offset;
    t.loc.field_1._8_8_ = local_50.loc.field_1._8_8_;
    t.token_type_ = local_50.token_type_;
    t._36_4_ = local_50._36_4_;
    t.field_2.text_._M_len = local_50.field_2.text_._M_len;
    t.field_2.text_._M_str = local_50.field_2.text_._M_str;
    t.field_2.literal_.text._M_str = local_50.field_2.literal_.text._M_str;
    TokenQueue::push_back(&this->tokens_,t);
  }
  __src = TokenQueue::front(&this->tokens_);
  memcpy(__return_storage_ptr__,__src,0x40);
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken());
  }
  return tokens_.front();
}